

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9MultiProve(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *p;
  Abc_Frame_t *pAbc_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  Bmc_MulPar_t Pars;
  Vec_Int_t *vStatuses;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  Bmc_MulPar_t local_68;
  Abc_Frame_t *local_40;
  Vec_Int_t *local_38;
  
  local_68.TimeOutGlo = 0;
  local_68.TimeOutLoc = 0;
  local_68.TimeOutInc = 0;
  local_68.TimeOutGap = 0;
  local_68.TimePerOut = 0;
  local_70 = 0;
  local_40 = pAbc;
  Extra_UtilGetoptReset();
  local_7c = 100;
  local_84 = 2;
  local_8c = 0x1e;
  local_74 = 0;
  local_78 = 0;
  local_6c = 0;
  local_88 = 0;
  local_80 = 0;
LAB_0022f59e:
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"TLMGHsdvwh"), pAbc_00 = local_40,
          iVar3 = globalUtilOptind, iVar1 < 0x54) {
      switch(iVar1) {
      case 0x47:
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-G\" should be followed by an integer.\n";
LAB_0022f7d2:
          Abc_Print(-1,pcVar4);
          goto switchD_0022f5ea_caseD_49;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_88 = uVar2;
        break;
      case 0x48:
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-H\" should be followed by an integer.\n";
          goto LAB_0022f7d2;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_80 = uVar2;
        break;
      case 0x49:
      case 0x4a:
      case 0x4b:
        goto switchD_0022f5ea_caseD_49;
      case 0x4c:
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-L\" should be followed by an integer.\n";
          goto LAB_0022f7d2;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_84 = uVar2;
        break;
      case 0x4d:
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-M\" should be followed by an integer.\n";
          goto LAB_0022f7d2;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_7c = uVar2;
        break;
      default:
        if (iVar1 == -1) {
          local_68.fVeryVerbose = local_6c;
          local_68.fVerbose = local_78;
          local_68.fDumpFinal = local_74;
          local_68.fUseSyn = local_70;
          local_68.TimePerOut = local_80;
          local_68.TimeOutGap = local_88;
          local_68.TimeOutInc = local_7c;
          local_68.TimeOutLoc = local_84;
          local_68.TimeOutGlo = local_8c;
          p = local_40->pGia;
          if (p == (Gia_Man_t *)0x0) {
            pcVar4 = "Abc_CommandAbc9MultiProve(): There is no AIG.\n";
          }
          else {
            if (p->nRegs != 0) {
              iVar3 = Gia_ManMultiProve(p,&local_68);
              pAbc_00->Status = iVar3;
              local_38 = Abc_FrameDeriveStatusArray(pAbc_00->pGia->vSeqModelVec);
              Abc_FrameReplacePoStatuses(pAbc_00,&local_38);
              Abc_FrameReplaceCexVec(pAbc_00,&pAbc_00->pGia->vSeqModelVec);
              return 0;
            }
            pcVar4 = "Abc_CommandAbc9MultiProve(): The problem is combinational.\n";
          }
          iVar3 = -1;
          goto LAB_0022f90d;
        }
        goto switchD_0022f5ea_caseD_49;
      }
      globalUtilOptind = iVar3 + 1;
      if ((int)uVar2 < 1) goto switchD_0022f5ea_caseD_49;
    }
    if (0x72 < iVar1) {
      if (iVar1 == 0x73) {
        local_70 = local_70 ^ 1;
      }
      else if (iVar1 == 0x76) {
        local_78 = local_78 ^ 1;
      }
      else {
        if (iVar1 != 0x77) goto switchD_0022f5ea_caseD_49;
        local_6c = local_6c ^ 1;
      }
      goto LAB_0022f59e;
    }
    if (iVar1 == 0x54) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-T\" should be followed by an integer.\n";
        goto LAB_0022f7d2;
      }
      local_8c = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar3 + 1;
      if ((int)local_8c < 0) {
switchD_0022f5ea_caseD_49:
        Abc_Print(-2,"usage: &mprove [-TLMGH num] [-sdvwh]\n");
        Abc_Print(-2,"\t         proves multi-output testcase by applying several engines\n");
        Abc_Print(-2,"\t-T num : approximate global runtime limit in seconds [default = %d]\n",
                  (ulong)local_8c);
        Abc_Print(-2,"\t-L num : approximate local runtime limit in seconds [default = %d]\n",
                  (ulong)local_84);
        Abc_Print(-2,"\t-M num : percentage of local runtime limit increase [default = %d]\n",
                  (ulong)local_7c);
        Abc_Print(-2,"\t-G num : approximate gap runtime limit in seconds [default = %d]\n",
                  (ulong)local_88);
        Abc_Print(-2,"\t-H num : timeout per output in miliseconds [default = %d]\n",(ulong)local_80
                 );
        pcVar5 = "yes";
        pcVar4 = "yes";
        if (local_70 == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-s     : toggle using combinational synthesis [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_74 == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-d     : toggle dumping invariant into a file [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_78 == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
        if (local_6c == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-w     : toggle printing additional verbose information [default = %s]\n",
                  pcVar5);
        pcVar4 = "\t-h     : print the command usage\n";
        iVar3 = -2;
LAB_0022f90d:
        Abc_Print(iVar3,pcVar4);
        return 1;
      }
    }
    else {
      if (iVar1 != 100) goto switchD_0022f5ea_caseD_49;
      local_74 = local_74 ^ 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9MultiProve( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Gia_ManMultiProve( Gia_Man_t * p, Bmc_MulPar_t * pPars );
    Vec_Int_t * vStatuses; int c;
    Bmc_MulPar_t Pars, * pPars = &Pars;
    memset( pPars, 0, sizeof(Bmc_MulPar_t) );
    pPars->TimeOutGlo =  30;
    pPars->TimeOutLoc =   2;
    pPars->TimeOutInc = 100;
    pPars->TimeOutGap =   0;
    pPars->TimePerOut =   0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "TLMGHsdvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOutGlo = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOutGlo < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOutLoc = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOutLoc <= 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOutInc = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOutInc <= 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOutGap = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOutGap <= 0 )
                goto usage;
            break;
        case 'H':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-H\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimePerOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimePerOut <= 0 )
                goto usage;
            break;
        case 's':
            pPars->fUseSyn ^= 1;
            break;
        case 'd':
            pPars->fDumpFinal ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9MultiProve(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9MultiProve(): The problem is combinational.\n" );
        return 1;
    }
    pAbc->Status = Gia_ManMultiProve( pAbc->pGia, pPars );
    vStatuses = Abc_FrameDeriveStatusArray( pAbc->pGia->vSeqModelVec );
    Abc_FrameReplacePoStatuses( pAbc, &vStatuses );        
    Abc_FrameReplaceCexVec( pAbc, &pAbc->pGia->vSeqModelVec );
    return 0;

usage:
    Abc_Print( -2, "usage: &mprove [-TLMGH num] [-sdvwh]\n" );
    Abc_Print( -2, "\t         proves multi-output testcase by applying several engines\n" );
    Abc_Print( -2, "\t-T num : approximate global runtime limit in seconds [default = %d]\n",     pPars->TimeOutGlo );
    Abc_Print( -2, "\t-L num : approximate local runtime limit in seconds [default = %d]\n",      pPars->TimeOutLoc );
    Abc_Print( -2, "\t-M num : percentage of local runtime limit increase [default = %d]\n",      pPars->TimeOutInc );
    Abc_Print( -2, "\t-G num : approximate gap runtime limit in seconds [default = %d]\n",        pPars->TimeOutGap );
    Abc_Print( -2, "\t-H num : timeout per output in miliseconds [default = %d]\n",               pPars->TimePerOut );
    Abc_Print( -2, "\t-s     : toggle using combinational synthesis [default = %s]\n",            pPars->fUseSyn?      "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle dumping invariant into a file [default = %s]\n",            pPars->fDumpFinal?   "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",             pPars->fVerbose?     "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing additional verbose information [default = %s]\n",  pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}